

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

bool __thiscall
slang::ast::DiagnosticVisitor::handleDefault<slang::ast::ProceduralCheckerStatement>
          (DiagnosticVisitor *this,ProceduralCheckerStatement *symbol)

{
  ProceduralCheckerStatement *in_RSI;
  DiagnosticVisitor *in_RDI;
  bool local_1;
  
  local_1 = finishedEarly(in_RDI);
  if (!local_1) {
    ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false>::
    visitDefault<slang::ast::ProceduralCheckerStatement>
              ((ASTVisitor<slang::ast::DiagnosticVisitor,_false,_false,_false,_false> *)in_RDI,
               in_RSI);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool handleDefault(const T& symbol) {
        if (finishedEarly())
            return false;

        if constexpr (std::is_base_of_v<Symbol, T>) {
            auto declaredType = symbol.getDeclaredType();
            if (declaredType) {
                declaredType->getType();
                declaredType->getInitializer();
            }

            if constexpr (std::is_same_v<EnumValueSymbol, T> ||
                          std::is_same_v<SpecparamSymbol, T>) {
                symbol.getValue();
            }
        }

        if constexpr (requires { symbol.getBody().bad(); }) {
            auto& body = symbol.getBody();
            if (body.bad())
                return true;

            body.visit(*this);
        }

        visitDefault(symbol);
        return true;
    }